

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O3

FT_UInt ps_unicodes_char_index(PS_Unicodes table,FT_UInt32 unicode)

{
  PS_UniMap *pPVar1;
  PS_UniMap *pPVar2;
  PS_UniMap *pPVar3;
  PS_UniMap *pPVar4;
  PS_UniMap *pPVar5;
  uint uVar6;
  
  pPVar1 = table->maps;
  pPVar2 = pPVar1 + ((ulong)table->num_maps - 1);
  if (pPVar1 <= pPVar2) {
    pPVar5 = (PS_UniMap *)0x0;
    do {
      pPVar4 = pPVar1 + ((long)pPVar2 - (long)pPVar1 >> 4);
      if (pPVar4->unicode == unicode) goto LAB_0015938a;
      uVar6 = pPVar4->unicode & 0x7fffffff;
      pPVar3 = pPVar4;
      if (uVar6 != unicode) {
        pPVar3 = pPVar5;
      }
      if (pPVar1 == pPVar2) break;
      if (uVar6 < unicode) {
        pPVar1 = pPVar4 + 1;
      }
      else {
        pPVar2 = pPVar4 + -1;
      }
      pPVar5 = pPVar3;
    } while (pPVar1 <= pPVar2);
    pPVar4 = pPVar3;
    if (pPVar3 != (PS_UniMap *)0x0) {
LAB_0015938a:
      return pPVar4->glyph_index;
    }
  }
  return 0;
}

Assistant:

static FT_UInt
  ps_unicodes_char_index( PS_Unicodes  table,
                          FT_UInt32    unicode )
  {
    PS_UniMap  *min, *max, *mid, *result = NULL;


    /* Perform a binary search on the table. */

    min = table->maps;
    max = min + table->num_maps - 1;

    while ( min <= max )
    {
      FT_UInt32  base_glyph;


      mid = min + ( ( max - min ) >> 1 );

      if ( mid->unicode == unicode )
      {
        result = mid;
        break;
      }

      base_glyph = BASE_GLYPH( mid->unicode );

      if ( base_glyph == unicode )
        result = mid; /* remember match but continue search for base glyph */

      if ( min == max )
        break;

      if ( base_glyph < unicode )
        min = mid + 1;
      else
        max = mid - 1;
    }

    if ( result )
      return result->glyph_index;
    else
      return 0;
  }